

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e304c3::AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test::TestBody
          (AV1Convolve2DCopyHighbdCompoundTest_RunTest_Test *this)

{
  AV1Convolve2DCopyHighbdCompoundTest *in_stack_00000040;
  
  AV1Convolve2DCopyHighbdCompoundTest::RunTest(in_stack_00000040);
  return;
}

Assistant:

TEST_P(AV1Convolve2DCopyHighbdCompoundTest, RunTest) { RunTest(); }